

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<int,_false,_6> __thiscall
immutable::vector<int,_false,_6>::insert
          (vector<int,_false,_6> *this,size_type_conflict pos,vector<int,_false,_6> *value)

{
  vector<int,_false,_6> *in_RCX;
  undefined4 in_register_00000034;
  vector<int,_false,_6> local_50 [3];
  vector<int,_false,_6> local_38;
  vector<int,_false,_6> local_30 [2];
  vector<int,_false,_6> *value_local;
  undefined8 uStack_18;
  size_type_conflict pos_local;
  vector<int,_false,_6> *this_local;
  
  uStack_18 = CONCAT44(in_register_00000034,pos);
  value_local._4_4_ = SUB84(value,0);
  this_local = this;
  take(&local_38,pos);
  operator+((immutable *)local_30,&local_38,in_RCX);
  drop(local_50,pos);
  operator+((immutable *)this,local_30,local_50);
  ~vector(local_50);
  ~vector(local_30);
  ~vector(&local_38);
  return (vector<int,_false,_6>)(ref<immutable::rrb<int,_false,_6>_>)this;
}

Assistant:

vector insert(size_type pos, vector value) const
        {
        return take(pos) + std::move(value) + drop(pos);
        }